

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_error.cpp
# Opt level: O0

error_category * __thiscall
pstore::exchange::import_ns::error_category::message_abi_cxx11_(error_category *this,int err)

{
  char *pcVar1;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  allocator local_29;
  char *local_28;
  char *result;
  undefined8 uStack_18;
  int err_local;
  error_category *this_local;
  
  uStack_18 = CONCAT44(in_register_00000034,err);
  local_28 = "unknown import error_category error";
  switch(in_EDX) {
  case 0:
    local_28 = "none";
    break;
  case 1:
    local_28 = "alignment must be a power of 2";
    break;
  case 2:
    local_28 = "alignment value is too large to be represented";
    break;
  case 3:
    local_28 = "duplicate name";
    break;
  case 4:
    local_28 = "no such name";
    break;
  case 5:
    local_28 = "no such compilation";
    break;
  case 6:
    local_28 = "no such fragment";
    break;
  case 7:
    local_28 = "unexpected null";
    break;
  case 8:
    local_28 = "unexpected boolean";
    break;
  case 9:
    local_28 = "unexpected number";
    break;
  case 10:
    local_28 = "unexpected string";
    break;
  case 0xb:
    local_28 = "unexpected array";
    break;
  case 0xc:
    local_28 = "unexpected end of array";
    break;
  case 0xd:
    local_28 = "unexpected object";
    break;
  case 0xe:
    local_28 = "unexpected object key";
    break;
  case 0xf:
    local_28 = "unexpected end object";
    break;
  case 0x10:
    local_28 = "bss section was incomplete";
    break;
  case 0x11:
    local_28 = "definition was incomplete";
    break;
  case 0x12:
    local_28 = "unrecognized internal fixup object key";
    break;
  case 0x13:
    local_28 = "internal fixup object was not complete";
    break;
  case 0x14:
    local_28 = "unrecognized external fixup object key";
    break;
  case 0x15:
    local_28 = "external fixup object was incomplete";
    break;
  case 0x16:
    local_28 = "generic section object was incomplete";
    break;
  case 0x17:
    local_28 = "unrecognized section object key";
    break;
  case 0x18:
    local_28 = "unrecognized root object key";
    break;
  case 0x19:
    local_28 = "root object was incomplete";
    break;
  case 0x1a:
    local_28 = "unrecognized transaction object key";
    break;
  case 0x1b:
    local_28 = "unknown compilation object key";
    break;
  case 0x1c:
    local_28 = "unknown definition object key";
    break;
  case 0x1d:
    local_28 = "compilation object was incomplete";
    break;
  case 0x1e:
    local_28 = "debug line section object was incomplete";
    break;
  case 0x1f:
    local_28 = "linked-definition object was incomplete";
    break;
  case 0x20:
    local_28 = "bad digest";
    break;
  case 0x21:
    local_28 = "bad Base64 data";
    break;
  case 0x22:
    local_28 = "unknown linkage type";
    break;
  case 0x23:
    local_28 = "bad UUID";
    break;
  case 0x24:
    local_28 = "unknown visibility";
    break;
  case 0x25:
    local_28 = "unknown section name";
    break;
  case 0x26:
    local_28 = "the target section of a fragment\'s internal fixup was not present";
    break;
  case 0x27:
    local_28 = "index out of range";
    break;
  case 0x28:
    local_28 = "debug line header digest was not found";
    break;
  case 0x29:
    local_28 = "number too large";
  }
  pcVar1 = local_28;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return this;
}

Assistant:

std::string error_category::message (int const err) const {
                auto const * result = "unknown import error_category error";
                switch (static_cast<error> (err)) {
                case error::none: result = "none"; break;

                case error::alignment_must_be_power_of_2:
                    result = "alignment must be a power of 2";
                    break;
                case error::alignment_is_too_great:
                    result = "alignment value is too large to be represented";
                    break;
                case error::duplicate_name: result = "duplicate name"; break;
                case error::no_such_name: result = "no such name"; break;
                case error::no_such_compilation: result = "no such compilation"; break;
                case error::no_such_fragment: result = "no such fragment"; break;
                case error::unexpected_null: result = "unexpected null"; break;
                case error::unexpected_boolean: result = "unexpected boolean"; break;
                case error::unexpected_number: result = "unexpected number"; break;
                case error::unexpected_string: result = "unexpected string"; break;
                case error::unexpected_array: result = "unexpected array"; break;
                case error::unexpected_end_array: result = "unexpected end of array"; break;
                case error::unexpected_object: result = "unexpected object"; break;
                case error::unexpected_object_key: result = "unexpected object key"; break;
                case error::unexpected_end_object: result = "unexpected end object"; break;


                case error::bss_section_was_incomplete:
                    result = "bss section was incomplete";
                    break;
                case error::definition_was_incomplete: result = "definition was incomplete"; break;
                case error::unrecognized_ifixup_key:
                    result = "unrecognized internal fixup object key";
                    break;
                case error::ifixup_object_was_incomplete:
                    result = "internal fixup object was not complete";
                    break;
                case error::unrecognized_xfixup_key:
                    result = "unrecognized external fixup object key";
                    break;
                case error::xfixup_object_was_incomplete:
                    result = "external fixup object was incomplete";
                    break;
                case error::unrecognized_section_object_key:
                    result = "unrecognized section object key";
                    break;
                case error::generic_section_was_incomplete:
                    result = "generic section object was incomplete";
                    break;
                case error::root_object_was_incomplete:
                    result = "root object was incomplete";
                    break;
                case error::unrecognized_root_key: result = "unrecognized root object key"; break;
                case error::unknown_transaction_object_key:
                    result = "unrecognized transaction object key";
                    break;
                case error::unknown_compilation_object_key:
                    result = "unknown compilation object key";
                    break;
                case error::unknown_definition_object_key:
                    result = "unknown definition object key";
                    break;

                case error::incomplete_debug_line_section:
                    result = "debug line section object was incomplete";
                    break;
                case error::incomplete_compilation_object:
                    result = "compilation object was incomplete";
                    break;
                case error::incomplete_linked_definition_object:
                    result = "linked-definition object was incomplete";
                    break;

                case error::bad_linkage: result = "unknown linkage type"; break;
                case error::bad_uuid: result = "bad UUID"; break;
                case error::bad_base64_data: result = "bad Base64 data"; break;
                case error::bad_digest: result = "bad digest"; break;
                case error::bad_visibility: result = "unknown visibility"; break;
                case error::index_out_of_range: result = "index out of range"; break;
                case error::unknown_section_name: result = "unknown section name"; break;

                case error::internal_fixup_target_not_found:
                    result = "the target section of a fragment's internal fixup was not present";
                    break;
                case error::debug_line_header_digest_not_found:
                    result = "debug line header digest was not found";
                    break;

                case error::number_too_large: result = "number too large"; break;
                }
                return result;
            }